

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZTransform<double> * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::BuildTransform2
          (TPZTransform<double> *__return_storage_ptr__,TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,
          int side,TPZGeoEl *father,TPZTransform<double> *t)

{
  int iVar1;
  TPZGeoEl *pTVar2;
  TPZGeoElSide fathloc;
  undefined1 auStack_1e8 [8];
  TPZGeoEl *local_1e0;
  undefined4 local_1d8;
  TPZTransform<double> local_1d0;
  
  if (this == (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *)father) {
    TPZTransform<double>::TPZTransform(__return_storage_ptr__,t);
  }
  else {
    pTVar2 = TPZGeoEl::Father(&this->super_TPZGeoEl);
    if (side == 0 && pTVar2 != (TPZGeoEl *)0x0) {
      (**(code **)(*(long *)&this->super_TPZGeoEl + 0x248))(auStack_1e8,this,side);
      iVar1 = TPZGeoEl::WhichSubel(&this->super_TPZGeoEl);
      (**(code **)(*(long *)pTVar2 + 0x1e8))(__return_storage_ptr__,pTVar2,side,iVar1);
      TPZTransform<double>::Multiply(&local_1d0,__return_storage_ptr__,t);
      TPZTransform<double>::operator=(__return_storage_ptr__,&local_1d0);
      TPZTransform<double>::~TPZTransform(&local_1d0);
      if (local_1e0 != father) {
        (**(code **)(*(long *)pTVar2 + 600))
                  (&local_1d0,pTVar2,local_1d8,father,__return_storage_ptr__);
        TPZTransform<double>::operator=(__return_storage_ptr__,&local_1d0);
        TPZTransform<double>::~TPZTransform(&local_1d0);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZGeoElRefLess::BuildTransform2 side out of range or father null\n",0x42);
      TPZTransform<double>::TPZTransform(__return_storage_ptr__,0,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<>
TPZGeoElRefLess<TGeo>::BuildTransform2(int side, TPZGeoEl * father, TPZTransform<> &t)
{
	if(this == father) return t;
	TPZGeoEl *myfather = Father();
	if(side<0 || side>(TGeo::NSides-1) || !myfather){
		PZError << "TPZGeoElRefLess::BuildTransform2 side out of range or father null\n";
		return TPZTransform<>(0,0);
	}
	TPZGeoElSide fathloc = Father2(side);
	int son = WhichSubel();
	TPZTransform<> trans=myfather->GetTransform(side,son);
	trans = trans.Multiply(t);
	if(fathloc.Element() == father) return trans;
	trans = myfather->BuildTransform2(fathloc.Side(),father,trans);
	return trans;
}